

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

Id dxil_spv::clamp_bitfield_width(Impl *impl,Id offset,Id width)

{
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  Operation *clamp_op;
  Operation *max_width_op;
  Builder *builder;
  Id width_local;
  Id offset_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(this,0x20);
  this_00 = Converter::Impl::allocate(impl,OpISub,IVar1);
  IVar1 = spv::Builder::makeUintConstant(this,0x20,false);
  Operation::add_id(this_00,IVar1);
  Operation::add_id(this_00,offset);
  Converter::Impl::add(impl,this_00,false);
  IVar1 = spv::Builder::makeUintType(this,0x20);
  this_01 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  Operation::add_id(this_01,impl->glsl_std450_ext);
  Operation::add_literal(this_01,0x26);
  Operation::add_id(this_01,width);
  Operation::add_id(this_01,this_00->id);
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

static spv::Id clamp_bitfield_width(Converter::Impl &impl, spv::Id offset, spv::Id width)
{
	auto &builder = impl.builder();
	// D3D has well-defined behavior when width + offset overflows in bitfield instructions.
	// To get similar behavior, we just need to clamp width.
	auto *max_width_op = impl.allocate(spv::OpISub, builder.makeUintType(32));
	max_width_op->add_id(builder.makeUintConstant(32));
	max_width_op->add_id(offset);
	impl.add(max_width_op);

	auto *clamp_op = impl.allocate(spv::OpExtInst, builder.makeUintType(32));
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");
	clamp_op->add_id(impl.glsl_std450_ext);
	clamp_op->add_literal(GLSLstd450UMin);
	clamp_op->add_id(width);
	clamp_op->add_id(max_width_op->id);
	impl.add(clamp_op);
	return clamp_op->id;
}